

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,XrFrameEndInfo *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrEnvironmentBlendMode XVar3;
  XrCompositionLayerProjection *value_00;
  XrCompositionLayerQuad *value_01;
  XrCompositionLayerCubeKHR *value_02;
  XrCompositionLayerCylinderKHR *value_03;
  XrCompositionLayerEquirectKHR *value_04;
  XrCompositionLayerEquirect2KHR *value_05;
  XrCompositionLayerPassthroughFB *value_06;
  XrCompositionLayerPassthroughHTC *value_07;
  char cVar4;
  char cVar5;
  NextChainResult NVar6;
  int iVar7;
  XrResult XVar8;
  pointer pcVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint __val;
  ulong uVar13;
  XrResult XVar14;
  string out;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  string local_350;
  string error_message;
  ios_base local_2c0 [264];
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_180;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_168;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_150;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_138;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_120;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_108;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_f0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_d8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  XVar14 = XR_SUCCESS;
  if (value->type != XR_TYPE_FRAME_END_INFO) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrFrameEndInfo",value->type,
               "VUID-XrFrameEndInfo-type-type",XR_TYPE_FRAME_END_INFO,"XR_TYPE_FRAME_END_INFO");
    XVar14 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (!check_pnext) goto LAB_0016bd48;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  error_message._M_dataplus._M_p._0_4_ = 0x3b9cd958;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::_M_realloc_insert<XrStructureType>
            (&valid_ext_structs,(iterator)0x0,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9cdd40;
  if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
    _M_realloc_insert<XrStructureType>
              (&valid_ext_structs,
               (iterator)
               valid_ext_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
  }
  else {
    *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl
     .super__Vector_impl_data._M_finish = XR_TYPE_GLOBAL_DIMMER_FRAME_END_INFO_ML;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  error_message._M_dataplus._M_p._0_4_ = 0x3b9e15c0;
  if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
    _M_realloc_insert<XrStructureType>
              (&valid_ext_structs,
               (iterator)
               valid_ext_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
  }
  else {
    *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl
     .super__Vector_impl_data._M_finish = XR_TYPE_LOCAL_DIMMING_FRAME_END_INFO_META;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  error_message._M_dataplus._M_p._0_4_ = 0x3b9b990b;
  if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
    _M_realloc_insert<XrStructureType>
              (&valid_ext_structs,
               (iterator)
               valid_ext_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
  }
  else {
    *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl
     .super__Vector_impl_data._M_finish = XR_TYPE_SECONDARY_VIEW_CONFIGURATION_FRAME_END_INFO_MSFT;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  NVar6 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar6 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ","");
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&out,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
    paVar1 = &out.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,"VUID-XrFrameEndInfo-next-unique","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_120,objects_info);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_350,
               "Multiple structures of the same type(s) in \"next\" chain for XrFrameEndInfo struct"
               ,"");
    CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_120,
                        &local_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if (local_120.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      uVar13 = out.field_2._M_allocated_capacity + 1;
      local_108.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)out._M_dataplus._M_p;
LAB_0016bcd2:
      operator_delete(local_108.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,uVar13);
    }
LAB_0016bcd7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p != &error_message.field_2) {
      operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1
                     );
    }
    XVar14 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar6 == NEXT_CHAIN_RESULT_ERROR) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,"VUID-XrFrameEndInfo-next-next","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_108,objects_info);
    out._M_dataplus._M_p = (pointer)&out.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,
               "Invalid structure(s) in \"next\" chain for XrFrameEndInfo struct \"next\"","");
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_108,&out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != &out.field_2) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    if (local_108.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar13 = (long)local_108.
                     super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)local_108.
                     super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_0016bcd2;
    }
    goto LAB_0016bcd7;
  }
  if (encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(encountered_structs.
                    super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)encountered_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)encountered_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(duplicate_ext_structs.
                    super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)duplicate_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)duplicate_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(valid_ext_structs.
                    super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)valid_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)valid_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0016bd48:
  if (!check_members || XVar14 != XR_SUCCESS) {
    return XVar14;
  }
  paVar1 = &error_message.field_2;
  error_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&error_message,"XrFrameEndInfo","");
  out._M_dataplus._M_p = (pointer)&out.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"environmentBlendMode","");
  XVar3 = value->environmentBlendMode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != &out.field_2) {
    operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_message._M_dataplus._M_p != paVar1) {
    operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  }
  if (XVar3 - XR_ENVIRONMENT_BLEND_MODE_OPAQUE < 3) {
    if ((value->layerCount == 0) || (value->layers != (XrCompositionLayerBaseHeader **)0x0)) {
      if (value->layers == (XrCompositionLayerBaseHeader **)0x0) {
        return XR_SUCCESS;
      }
      if (value->layerCount == 0) {
        return XR_SUCCESS;
      }
      XVar14 = XR_SUCCESS;
      uVar13 = 0;
      while( true ) {
        __val = (uint)uVar13;
        value_00 = (XrCompositionLayerProjection *)value->layers[uVar13];
        if (value_00 == (XrCompositionLayerProjection *)0x0) break;
        if (value->layers == (XrCompositionLayerBaseHeader **)0x0) {
LAB_0016c03b:
          if (value->layers != (XrCompositionLayerBaseHeader **)0x0) {
            value_01 = (XrCompositionLayerQuad *)value->layers[uVar13];
            iVar7 = 0;
            if (value_01->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
              XVar14 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                        value_01);
              if (XVar14 == XR_SUCCESS) {
                XVar14 = XR_SUCCESS;
                iVar7 = 4;
              }
              else {
                error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&error_message,"Structure XrFrameEndInfo member layers","");
                std::__cxx11::string::append((char *)&error_message);
                cVar5 = '\x01';
                if (9 < __val) {
                  uVar12 = uVar13;
                  cVar4 = '\x04';
                  do {
                    cVar5 = cVar4;
                    uVar10 = (uint)uVar12;
                    if (uVar10 < 100) {
                      cVar5 = cVar5 + -2;
                      goto LAB_0016c113;
                    }
                    if (uVar10 < 1000) {
                      cVar5 = cVar5 + -1;
                      goto LAB_0016c113;
                    }
                    if (uVar10 < 10000) goto LAB_0016c113;
                    uVar12 = uVar12 / 10000;
                    cVar4 = cVar5 + '\x04';
                  } while (99999 < uVar10);
                  cVar5 = cVar5 + '\x01';
                }
LAB_0016c113:
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct((ulong)&out,cVar5);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
                std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&error_message);
                std::__cxx11::string::append((char *)&error_message);
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&out,"VUID-XrFrameEndInfo-layers-parameter","");
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_60,objects_info);
                CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                                    ,&local_60,&error_message);
                if (local_60.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_60.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_60.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_60.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)error_message._M_dataplus._M_p != &error_message.field_2) {
                  operator_delete(error_message._M_dataplus._M_p,
                                  error_message.field_2._M_allocated_capacity + 1);
                }
                iVar7 = 1;
              }
            }
            if (iVar7 == 4) goto LAB_0016cebe;
            if (iVar7 != 0) {
              return XR_ERROR_VALIDATION_FAILURE;
            }
          }
          if (value->layers != (XrCompositionLayerBaseHeader **)0x0) {
            value_02 = (XrCompositionLayerCubeKHR *)value->layers[uVar13];
            iVar7 = 0;
            if (value_02->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
              XVar14 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                        value_02);
              if (XVar14 == XR_SUCCESS) {
                XVar14 = XR_SUCCESS;
                iVar7 = 4;
              }
              else {
                error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&error_message,"Structure XrFrameEndInfo member layers","");
                std::__cxx11::string::append((char *)&error_message);
                cVar5 = '\x01';
                if (9 < __val) {
                  uVar12 = uVar13;
                  cVar4 = '\x04';
                  do {
                    cVar5 = cVar4;
                    uVar10 = (uint)uVar12;
                    if (uVar10 < 100) {
                      cVar5 = cVar5 + -2;
                      goto LAB_0016c32f;
                    }
                    if (uVar10 < 1000) {
                      cVar5 = cVar5 + -1;
                      goto LAB_0016c32f;
                    }
                    if (uVar10 < 10000) goto LAB_0016c32f;
                    uVar12 = uVar12 / 10000;
                    cVar4 = cVar5 + '\x04';
                  } while (99999 < uVar10);
                  cVar5 = cVar5 + '\x01';
                }
LAB_0016c32f:
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct((ulong)&out,cVar5);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
                std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&error_message);
                std::__cxx11::string::append((char *)&error_message);
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&out,"VUID-XrFrameEndInfo-layers-parameter","");
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_78,objects_info);
                CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                                    ,&local_78,&error_message);
                if (local_78.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_78.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_78.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_78.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)error_message._M_dataplus._M_p != &error_message.field_2) {
                  operator_delete(error_message._M_dataplus._M_p,
                                  error_message.field_2._M_allocated_capacity + 1);
                }
                iVar7 = 1;
              }
            }
            if (iVar7 == 4) goto LAB_0016cebe;
            if (iVar7 != 0) {
              return XR_ERROR_VALIDATION_FAILURE;
            }
          }
          if (value->layers != (XrCompositionLayerBaseHeader **)0x0) {
            value_03 = (XrCompositionLayerCylinderKHR *)value->layers[uVar13];
            iVar7 = 0;
            if (value_03->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
              XVar14 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                        value_03);
              if (XVar14 == XR_SUCCESS) {
                XVar14 = XR_SUCCESS;
                iVar7 = 4;
              }
              else {
                error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&error_message,"Structure XrFrameEndInfo member layers","");
                std::__cxx11::string::append((char *)&error_message);
                cVar5 = '\x01';
                if (9 < __val) {
                  uVar12 = uVar13;
                  cVar4 = '\x04';
                  do {
                    cVar5 = cVar4;
                    uVar10 = (uint)uVar12;
                    if (uVar10 < 100) {
                      cVar5 = cVar5 + -2;
                      goto LAB_0016c54b;
                    }
                    if (uVar10 < 1000) {
                      cVar5 = cVar5 + -1;
                      goto LAB_0016c54b;
                    }
                    if (uVar10 < 10000) goto LAB_0016c54b;
                    uVar12 = uVar12 / 10000;
                    cVar4 = cVar5 + '\x04';
                  } while (99999 < uVar10);
                  cVar5 = cVar5 + '\x01';
                }
LAB_0016c54b:
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct((ulong)&out,cVar5);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
                std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&error_message);
                std::__cxx11::string::append((char *)&error_message);
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&out,"VUID-XrFrameEndInfo-layers-parameter","");
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_90,objects_info);
                CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                                    ,&local_90,&error_message);
                if (local_90.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_90.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_90.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_90.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)error_message._M_dataplus._M_p != &error_message.field_2) {
                  operator_delete(error_message._M_dataplus._M_p,
                                  error_message.field_2._M_allocated_capacity + 1);
                }
                iVar7 = 1;
              }
            }
            if (iVar7 == 4) goto LAB_0016cebe;
            if (iVar7 != 0) {
              return XR_ERROR_VALIDATION_FAILURE;
            }
          }
          if (value->layers != (XrCompositionLayerBaseHeader **)0x0) {
            value_04 = (XrCompositionLayerEquirectKHR *)value->layers[uVar13];
            iVar7 = 0;
            if (value_04->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
              XVar14 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                        value_04);
              if (XVar14 == XR_SUCCESS) {
                XVar14 = XR_SUCCESS;
                iVar7 = 4;
              }
              else {
                error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&error_message,"Structure XrFrameEndInfo member layers","");
                std::__cxx11::string::append((char *)&error_message);
                cVar5 = '\x01';
                if (9 < __val) {
                  uVar12 = uVar13;
                  cVar4 = '\x04';
                  do {
                    cVar5 = cVar4;
                    uVar10 = (uint)uVar12;
                    if (uVar10 < 100) {
                      cVar5 = cVar5 + -2;
                      goto LAB_0016c767;
                    }
                    if (uVar10 < 1000) {
                      cVar5 = cVar5 + -1;
                      goto LAB_0016c767;
                    }
                    if (uVar10 < 10000) goto LAB_0016c767;
                    uVar12 = uVar12 / 10000;
                    cVar4 = cVar5 + '\x04';
                  } while (99999 < uVar10);
                  cVar5 = cVar5 + '\x01';
                }
LAB_0016c767:
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct((ulong)&out,cVar5);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
                std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&error_message);
                std::__cxx11::string::append((char *)&error_message);
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&out,"VUID-XrFrameEndInfo-layers-parameter","");
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_a8,objects_info);
                CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                                    ,&local_a8,&error_message);
                if (local_a8.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_a8.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_a8.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_a8.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)error_message._M_dataplus._M_p != &error_message.field_2) {
                  operator_delete(error_message._M_dataplus._M_p,
                                  error_message.field_2._M_allocated_capacity + 1);
                }
                iVar7 = 1;
              }
            }
            if (iVar7 == 4) goto LAB_0016cebe;
            if (iVar7 != 0) {
              return XR_ERROR_VALIDATION_FAILURE;
            }
          }
          if (value->layers != (XrCompositionLayerBaseHeader **)0x0) {
            value_05 = (XrCompositionLayerEquirect2KHR *)value->layers[uVar13];
            iVar7 = 0;
            if (value_05->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
              XVar14 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                        value_05);
              if (XVar14 == XR_SUCCESS) {
                XVar14 = XR_SUCCESS;
                iVar7 = 4;
              }
              else {
                error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&error_message,"Structure XrFrameEndInfo member layers","");
                std::__cxx11::string::append((char *)&error_message);
                cVar5 = '\x01';
                if (9 < __val) {
                  uVar12 = uVar13;
                  cVar4 = '\x04';
                  do {
                    cVar5 = cVar4;
                    uVar10 = (uint)uVar12;
                    if (uVar10 < 100) {
                      cVar5 = cVar5 + -2;
                      goto LAB_0016c983;
                    }
                    if (uVar10 < 1000) {
                      cVar5 = cVar5 + -1;
                      goto LAB_0016c983;
                    }
                    if (uVar10 < 10000) goto LAB_0016c983;
                    uVar12 = uVar12 / 10000;
                    cVar4 = cVar5 + '\x04';
                  } while (99999 < uVar10);
                  cVar5 = cVar5 + '\x01';
                }
LAB_0016c983:
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct((ulong)&out,cVar5);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
                std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&error_message);
                std::__cxx11::string::append((char *)&error_message);
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&out,"VUID-XrFrameEndInfo-layers-parameter","");
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_c0,objects_info);
                CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                                    ,&local_c0,&error_message);
                if (local_c0.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_c0.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_c0.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_c0.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)error_message._M_dataplus._M_p != &error_message.field_2) {
                  operator_delete(error_message._M_dataplus._M_p,
                                  error_message.field_2._M_allocated_capacity + 1);
                }
                iVar7 = 1;
              }
            }
            if (iVar7 == 4) goto LAB_0016cebe;
            if (iVar7 != 0) {
              return XR_ERROR_VALIDATION_FAILURE;
            }
          }
          if (value->layers != (XrCompositionLayerBaseHeader **)0x0) {
            value_06 = (XrCompositionLayerPassthroughFB *)value->layers[uVar13];
            iVar7 = 0;
            if (value_06->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
              XVar14 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                        value_06);
              if (XVar14 == XR_SUCCESS) {
                XVar14 = XR_SUCCESS;
                iVar7 = 4;
              }
              else {
                error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&error_message,"Structure XrFrameEndInfo member layers","");
                std::__cxx11::string::append((char *)&error_message);
                cVar5 = '\x01';
                if (9 < __val) {
                  uVar12 = uVar13;
                  cVar4 = '\x04';
                  do {
                    cVar5 = cVar4;
                    uVar10 = (uint)uVar12;
                    if (uVar10 < 100) {
                      cVar5 = cVar5 + -2;
                      goto LAB_0016cb9f;
                    }
                    if (uVar10 < 1000) {
                      cVar5 = cVar5 + -1;
                      goto LAB_0016cb9f;
                    }
                    if (uVar10 < 10000) goto LAB_0016cb9f;
                    uVar12 = uVar12 / 10000;
                    cVar4 = cVar5 + '\x04';
                  } while (99999 < uVar10);
                  cVar5 = cVar5 + '\x01';
                }
LAB_0016cb9f:
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct((ulong)&out,cVar5);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
                std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&error_message);
                std::__cxx11::string::append((char *)&error_message);
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&out,"VUID-XrFrameEndInfo-layers-parameter","");
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_d8,objects_info);
                CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                                    ,&local_d8,&error_message);
                if (local_d8.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_d8.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_d8.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_d8.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)error_message._M_dataplus._M_p != &error_message.field_2) {
                  operator_delete(error_message._M_dataplus._M_p,
                                  error_message.field_2._M_allocated_capacity + 1);
                }
                iVar7 = 1;
              }
            }
            if (iVar7 == 4) goto LAB_0016cebe;
            if (iVar7 != 0) {
              return XR_ERROR_VALIDATION_FAILURE;
            }
          }
          if (value->layers != (XrCompositionLayerBaseHeader **)0x0) {
            value_07 = (XrCompositionLayerPassthroughHTC *)value->layers[uVar13];
            iVar7 = 0;
            if (value_07->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
              XVar14 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                        value_07);
              if (XVar14 == XR_SUCCESS) {
                XVar14 = XR_SUCCESS;
                iVar7 = 4;
              }
              else {
                error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&error_message,"Structure XrFrameEndInfo member layers","");
                std::__cxx11::string::append((char *)&error_message);
                std::__cxx11::to_string(&out,__val);
                std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&error_message);
                std::__cxx11::string::append((char *)&error_message);
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&out,"VUID-XrFrameEndInfo-layers-parameter","");
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_f0,objects_info);
                CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                                    ,&local_f0,&error_message);
                if (local_f0.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_f0.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_f0.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_f0.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)error_message._M_dataplus._M_p != &error_message.field_2) {
                  operator_delete(error_message._M_dataplus._M_p,
                                  error_message.field_2._M_allocated_capacity + 1);
                }
                iVar7 = 1;
              }
            }
            if (iVar7 == 4) goto LAB_0016cebe;
            if (iVar7 != 0) {
              return XR_ERROR_VALIDATION_FAILURE;
            }
          }
          if (value->layers[uVar13] != (XrCompositionLayerBaseHeader *)0x0) {
            XVar14 = XR_SUCCESS;
            XVar8 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                                     value->layers[uVar13]);
            if (XVar8 != XR_SUCCESS) {
              error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&error_message,"VUID-XrFrameEndInfo-layers-parameter","");
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_180,objects_info);
              out._M_dataplus._M_p = (pointer)&out.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&out,"Structure XrFrameEndInfo member layers is invalid","");
              CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  command_name,&local_180,&out);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)out._M_dataplus._M_p != &out.field_2) {
                operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
              }
              if (local_180.
                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_180.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_180.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_180.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)error_message._M_dataplus._M_p != &error_message.field_2) {
                operator_delete(error_message._M_dataplus._M_p,
                                error_message.field_2._M_allocated_capacity + 1);
                return XVar8;
              }
              return XVar8;
            }
          }
        }
        else {
          iVar7 = 0;
          if (value_00->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
            XVar14 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                      value_00);
            if (XVar14 == XR_SUCCESS) {
              XVar14 = XR_SUCCESS;
              iVar7 = 4;
            }
            else {
              error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&error_message,"Structure XrFrameEndInfo member layers","");
              std::__cxx11::string::append((char *)&error_message);
              cVar5 = '\x01';
              if (9 < __val) {
                uVar12 = uVar13;
                cVar4 = '\x04';
                do {
                  cVar5 = cVar4;
                  uVar10 = (uint)uVar12;
                  if (uVar10 < 100) {
                    cVar5 = cVar5 + -2;
                    goto LAB_0016befa;
                  }
                  if (uVar10 < 1000) {
                    cVar5 = cVar5 + -1;
                    goto LAB_0016befa;
                  }
                  if (uVar10 < 10000) goto LAB_0016befa;
                  uVar12 = uVar12 / 10000;
                  cVar4 = cVar5 + '\x04';
                } while (99999 < uVar10);
                cVar5 = cVar5 + '\x01';
              }
LAB_0016befa:
              out._M_dataplus._M_p = (pointer)&out.field_2;
              std::__cxx11::string::_M_construct((ulong)&out,cVar5);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
              std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)out._M_dataplus._M_p != &out.field_2) {
                operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::append((char *)&error_message);
              out._M_dataplus._M_p = (pointer)&out.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&out,"VUID-XrFrameEndInfo-layers-parameter","");
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_48,objects_info);
              CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                  &local_48,&error_message);
              if (local_48.
                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_48.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_48.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_48.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)out._M_dataplus._M_p != &out.field_2) {
                operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)error_message._M_dataplus._M_p != &error_message.field_2) {
                operator_delete(error_message._M_dataplus._M_p,
                                error_message.field_2._M_allocated_capacity + 1);
              }
              iVar7 = 1;
            }
          }
          if (iVar7 != 4) {
            if (iVar7 != 0) {
              return XR_ERROR_VALIDATION_FAILURE;
            }
            goto LAB_0016c03b;
          }
        }
LAB_0016cebe:
        uVar13 = (ulong)(__val + 1);
        if (value->layerCount <= __val + 1) {
          return XVar14;
        }
      }
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,"Structure XrFrameEndInfo member layers","");
      std::__cxx11::string::append((char *)&error_message);
      paVar1 = &out.field_2;
      cVar5 = '\x01';
      if (9 < __val) {
        cVar4 = '\x04';
        do {
          cVar5 = cVar4;
          uVar10 = (uint)uVar13;
          if (uVar10 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_0016d1c6;
          }
          if (uVar10 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_0016d1c6;
          }
          if (uVar10 < 10000) goto LAB_0016d1c6;
          uVar13 = uVar13 / 10000;
          cVar4 = cVar5 + '\x04';
        } while (99999 < uVar10);
        cVar5 = cVar5 + '\x01';
      }
LAB_0016d1c6:
      out._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&out,cVar5);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
      std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar1) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&error_message);
      std::__cxx11::string::append((char *)&error_message);
      out._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&out,"VUID-XrFrameEndInfo-layers-parameter","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_168,objects_info);
      CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          &local_168,&error_message);
      if (local_168.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_168.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar1) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p == &error_message.field_2) {
        return XR_ERROR_VALIDATION_FAILURE;
      }
    }
    else {
      error_message._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,"VUID-XrFrameEndInfo-layers-parameter","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_150,objects_info);
      out._M_dataplus._M_p = (pointer)&out.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&out,
                 "Structure XrFrameEndInfo member layerCount is NULL, but value->layerCount is greater than 0"
                 ,"");
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,&local_150,&out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != &out.field_2) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      if (local_150.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_150.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p == paVar1) {
        return XR_ERROR_VALIDATION_FAILURE;
      }
    }
    operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,
               "XrFrameEndInfo contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value "
               ,0x59);
    local_350._M_dataplus._M_p._0_4_ = value->environmentBlendMode;
    paVar1 = &out.field_2;
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&out,'\n');
    *out._M_dataplus._M_p = '0';
    out._M_dataplus._M_p[1] = 'x';
    pcVar9 = out._M_dataplus._M_p +
             CONCAT44(out._M_string_length._4_4_,(uint)out._M_string_length) + -1;
    lVar11 = 0;
    do {
      bVar2 = *(byte *)((long)&local_350._M_dataplus._M_p + lVar11);
      *pcVar9 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar9[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar11 = lVar11 + 1;
      pcVar9 = pcVar9 + -2;
    } while (lVar11 != 4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,out._M_dataplus._M_p,
               CONCAT44(out._M_string_length._4_4_,(uint)out._M_string_length));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,"VUID-XrFrameEndInfo-environmentBlendMode-parameter","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_138,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_138,
                        &local_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if (local_138.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    std::ios_base::~ios_base(local_2c0);
  }
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrFrameEndInfo* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_FRAME_END_INFO) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrFrameEndInfo",
                             value->type, "VUID-XrFrameEndInfo-type-type", XR_TYPE_FRAME_END_INFO, "XR_TYPE_FRAME_END_INFO");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        valid_ext_structs.push_back(XR_TYPE_FRAME_END_INFO_ML);
        valid_ext_structs.push_back(XR_TYPE_GLOBAL_DIMMER_FRAME_END_INFO_ML);
        valid_ext_structs.push_back(XR_TYPE_LOCAL_DIMMING_FRAME_END_INFO_META);
        valid_ext_structs.push_back(XR_TYPE_SECONDARY_VIEW_CONFIGURATION_FRAME_END_INFO_MSFT);
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrFrameEndInfo struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrFrameEndInfo : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrFrameEndInfo struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrEnvironmentBlendMode value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrFrameEndInfo", "environmentBlendMode", objects_info, value->environmentBlendMode)) {
        std::ostringstream oss_enum;
        oss_enum << "XrFrameEndInfo contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->environmentBlendMode));
        CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-environmentBlendMode-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Optional array must be non-NULL when value->layerCount is non-zero
    if (0 != value->layerCount && nullptr == value->layers) {
        CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrFrameEndInfo member layerCount is NULL, but value->layerCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->layers) {
        for (uint32_t value_layers_inc = 0; value_layers_inc < value->layerCount; ++value_layers_inc) {
            if (value->layers[value_layers_inc] == nullptr) {
                std::string error_message = "Structure XrFrameEndInfo member layers";
                error_message += "[";
                error_message += std::to_string(value_layers_inc);
                error_message += "]";
                error_message += " is null";
                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerProjection and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerProjection* const* new_compositionlayerprojection_value = reinterpret_cast<const XrCompositionLayerProjection* const*>(value->layers);
                    if (new_compositionlayerprojection_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
                        if (nullptr != new_compositionlayerprojection_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerprojection_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerQuad and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerQuad* const* new_compositionlayerquad_value = reinterpret_cast<const XrCompositionLayerQuad* const*>(value->layers);
                    if (new_compositionlayerquad_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
                        if (nullptr != new_compositionlayerquad_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerquad_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCubeKHR and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerCubeKHR* const* new_compositionlayercubekhr_value = reinterpret_cast<const XrCompositionLayerCubeKHR* const*>(value->layers);
                    if (new_compositionlayercubekhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
                        if (nullptr != new_compositionlayercubekhr_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayercubekhr_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCylinderKHR and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerCylinderKHR* const* new_compositionlayercylinderkhr_value = reinterpret_cast<const XrCompositionLayerCylinderKHR* const*>(value->layers);
                    if (new_compositionlayercylinderkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
                        if (nullptr != new_compositionlayercylinderkhr_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayercylinderkhr_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirectKHR and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerEquirectKHR* const* new_compositionlayerequirectkhr_value = reinterpret_cast<const XrCompositionLayerEquirectKHR* const*>(value->layers);
                    if (new_compositionlayerequirectkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
                        if (nullptr != new_compositionlayerequirectkhr_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerequirectkhr_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirect2KHR and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerEquirect2KHR* const* new_compositionlayerequirect2khr_value = reinterpret_cast<const XrCompositionLayerEquirect2KHR* const*>(value->layers);
                    if (new_compositionlayerequirect2khr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
                        if (nullptr != new_compositionlayerequirect2khr_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerequirect2khr_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughFB and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerPassthroughFB* const* new_compositionlayerpassthroughfb_value = reinterpret_cast<const XrCompositionLayerPassthroughFB* const*>(value->layers);
                    if (new_compositionlayerpassthroughfb_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
                        if (nullptr != new_compositionlayerpassthroughfb_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerpassthroughfb_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughHTC and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerPassthroughHTC* const* new_compositionlayerpassthroughhtc_value = reinterpret_cast<const XrCompositionLayerPassthroughHTC* const*>(value->layers);
                    if (new_compositionlayerpassthroughhtc_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
                        if (nullptr != new_compositionlayerpassthroughhtc_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerpassthroughhtc_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate that the base-structure XrCompositionLayerBaseHeader is valid
            if (nullptr != value->layers[value_layers_inc]) {
                xr_result = ValidateXrStruct(instance_info, command_name,
                                                                objects_info, check_members, true, value->layers[value_layers_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                        objects_info,
                                        "Structure XrFrameEndInfo member layers is invalid");
                    return xr_result;
                }
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}